

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDwaLookups.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_e7d6e::LutHeaderWorker::run(LutHeaderWorker *this,bool outputProgress)

{
  uint16_t uVar1;
  int iVar2;
  int iVar3;
  byte in_SIL;
  LutHeaderWorker *in_RDI;
  float fVar4;
  float fVar5;
  double dVar6;
  double dVar7;
  int i_2;
  half tmp;
  int jCnt;
  int iCnt;
  int j;
  int i_1;
  half tmpHalf;
  int i;
  bool valueFound;
  int targetNumSetBits;
  half closestHalf;
  half inputHalf;
  int numSetBits;
  size_t input;
  int candidateCount;
  half candidate [16];
  undefined4 in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  int local_78;
  int local_68;
  int local_64;
  half local_5e;
  int local_5c;
  byte local_55;
  int local_54;
  half local_50;
  half local_4e;
  int local_4c;
  ulong local_48;
  int local_3c;
  half local_38 [23];
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_3c = 0;
  for (local_48 = in_RDI->_startValue; local_48 < in_RDI->_endValue; local_48 = local_48 + 1) {
    local_4c = countSetBits(in_RDI,(unsigned_short)local_48);
    Imath_3_2::half::setBits(&local_4e,(uint16_t)local_48);
    Imath_3_2::half::setBits(&local_50,0);
    in_RDI->_offset[local_48 - in_RDI->_startValue] = in_RDI->_numElements;
    local_3c = 0;
    local_54 = local_4c;
    while (local_54 = local_54 + -1, -1 < local_54) {
      local_55 = 0;
      for (local_5c = 0; local_5c < 0x10000; local_5c = local_5c + 1) {
        iVar2 = countSetBits(in_RDI,(unsigned_short)local_5c);
        if (iVar2 == local_54) {
          if ((local_55 & 1) == 0) {
            Imath_3_2::half::setBits(&local_50,(uint16_t)local_5c);
            local_55 = 1;
          }
          else {
            Imath_3_2::half::setBits(&local_5e,(uint16_t)local_5c);
            in_stack_ffffffffffffff74 =
                 Imath_3_2::half::operator_cast_to_float
                           ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
            fVar4 = Imath_3_2::half::operator_cast_to_float
                              ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
                              );
            dVar6 = std::fabs((double)(ulong)(uint)(in_stack_ffffffffffffff74 - fVar4));
            fVar4 = Imath_3_2::half::operator_cast_to_float
                              ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
                              );
            fVar5 = Imath_3_2::half::operator_cast_to_float
                              ((half *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
                              );
            dVar7 = std::fabs((double)(ulong)(uint)(fVar4 - fVar5));
            if (SUB84(dVar6,0) < SUB84(dVar7,0)) {
              local_50._h = local_5e._h;
            }
          }
        }
      }
      local_38[local_3c]._h = local_50._h;
      local_3c = local_3c + 1;
    }
    for (local_64 = 0; local_68 = local_64, local_64 < local_3c; local_64 = local_64 + 1) {
      while (local_68 = local_68 + 1, local_68 < local_3c) {
        uVar1 = Imath_3_2::half::bits(local_38 + local_64);
        iVar2 = countSetBits(in_RDI,uVar1);
        uVar1 = Imath_3_2::half::bits(local_38 + local_68);
        iVar3 = countSetBits(in_RDI,uVar1);
        if (iVar3 < iVar2) {
          uVar1 = local_38[local_64]._h;
          local_38[local_64]._h = local_38[local_68]._h;
          local_38[local_68]._h = uVar1;
        }
      }
    }
    for (local_78 = 0; local_78 < local_3c; local_78 = local_78 + 1) {
      uVar1 = Imath_3_2::half::bits(local_38 + local_78);
      in_RDI->_elements[in_RDI->_numElements] = uVar1;
      in_RDI->_numElements = in_RDI->_numElements + 1;
    }
    if (local_48 == in_RDI->_endValue - 1) {
      in_RDI->_lastCandidateCount = (long)local_3c;
    }
  }
  return;
}

Assistant:

void run (bool outputProgress)
    {
        half candidate[16];
        int  candidateCount = 0;

        for (size_t input = _startValue; input < _endValue; ++input)
        {

            int  numSetBits = countSetBits (input);
            half inputHalf, closestHalf;

            inputHalf.setBits (input);
            closestHalf.setBits (0);

            _offset[input - _startValue] = _numElements;

            // Gather candidates
            candidateCount = 0;
            for (int targetNumSetBits = numSetBits - 1; targetNumSetBits >= 0;
                 --targetNumSetBits)
            {
                bool valueFound = false;

                for (int i = 0; i < 65536; ++i)
                {
                    if (countSetBits (i) != targetNumSetBits) continue;

                    if (!valueFound)
                    {
                        closestHalf.setBits (i);
                        valueFound = true;
                    }
                    else
                    {
                        half tmpHalf;

                        tmpHalf.setBits (i);

                        if (fabs ((float) inputHalf - (float) tmpHalf) <
                            fabs ((float) inputHalf - (float) closestHalf))
                        {
                            closestHalf = tmpHalf;
                        }
                    }
                }

                candidate[candidateCount] = closestHalf;
                candidateCount++;
            }

            // Sort candidates by increasing number of bits set
            for (int i = 0; i < candidateCount; ++i)
            {
                for (int j = i + 1; j < candidateCount; ++j)
                {

                    int iCnt = countSetBits (candidate[i].bits ());
                    int jCnt = countSetBits (candidate[j].bits ());

                    if (jCnt < iCnt)
                    {
                        half tmp     = candidate[i];
                        candidate[i] = candidate[j];
                        candidate[j] = tmp;
                    }
                }
            }

            // Copy candidates to the data buffer;
            for (int i = 0; i < candidateCount; ++i)
            {
                _elements[_numElements] = candidate[i].bits ();
                _numElements++;
            }

            if (input == _endValue - 1)
            {
                _lastCandidateCount = candidateCount;
            }
        }
    }